

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTempor.c
# Opt level: O0

Aig_Man_t * Saig_ManTemporFrames(Aig_Man_t *pAig,int nFrames)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Man_t *p;
  char *pcVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  int local_40;
  int local_3c;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  Aig_ManCleanData(pAig);
  iVar2 = Aig_ManObjNumMax(pAig);
  p = Aig_ManStart(iVar2 * nFrames);
  pcVar3 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar3;
  for (local_3c = 0; iVar2 = Saig_ManRegNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
    pVVar1 = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pvVar4 = Vec_PtrEntry(pVVar1,local_3c + iVar2);
    pAVar5 = Aig_ManConst0(p);
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
  }
  for (local_40 = 0; local_40 < nFrames; local_40 = local_40 + 1) {
    pAVar5 = Aig_ManConst1(p);
    pAVar6 = Aig_ManConst1(pAig);
    (pAVar6->field_5).pData = pAVar5;
    for (local_3c = 0; iVar2 = Saig_ManPiNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,local_3c);
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
    }
    for (local_3c = 0; iVar2 = Vec_PtrSize(pAig->vObjs), local_3c < iVar2; local_3c = local_3c + 1)
    {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_3c);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        p1 = Aig_ObjChild1Copy(pAVar5);
        pAVar6 = Aig_And(p,pAVar6,p1);
        (pAVar5->field_5).pData = pAVar6;
      }
    }
    for (local_3c = 0; iVar2 = Vec_PtrSize(pAig->vCos), local_3c < iVar2; local_3c = local_3c + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_3c);
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      (pAVar5->field_5).pData = pAVar6;
    }
    for (local_3c = 0; iVar2 = Saig_ManRegNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
      pAVar5 = Saig_ManLi(pAig,local_3c);
      pAVar6 = Saig_ManLo(pAig,local_3c);
      pAVar6->field_5 = pAVar5->field_5;
    }
  }
  for (local_3c = 0; iVar2 = Saig_ManRegNum(pAig), local_3c < iVar2; local_3c = local_3c + 1) {
    pVVar1 = pAig->vCos;
    iVar2 = Saig_ManPoNum(pAig);
    pvVar4 = Vec_PtrEntry(pVVar1,local_3c + iVar2);
    Aig_ObjCreateCo(p,*(Aig_Obj_t **)((long)pvVar4 + 0x28));
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates initialized timeframes for temporal decomposition.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Saig_ManTemporFrames( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    // start the frames package
    Aig_ManCleanData( pAig );
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    // initiliaze the flops
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ManConst0(pFrames);
    // for each timeframe
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManConst1(pAig)->pData = Aig_ManConst1(pFrames);
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi(pFrames);
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Aig_ManForEachCo( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    // create POs for the flop inputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, (Aig_Obj_t *)pObj->pData );
    Aig_ManCleanup( pFrames );
    return pFrames;
}